

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_dump_scalar(yaml_emitter_t *emitter,yaml_node_t *node,yaml_char_t *anchor)

{
  int iVar1;
  int quoted_implicit;
  int plain_implicit;
  yaml_mark_t mark;
  yaml_event_t event;
  yaml_char_t *anchor_local;
  yaml_node_t *node_local;
  yaml_emitter_t *emitter_local;
  
  memset(&quoted_implicit,0,0x18);
  strcmp((char *)node->tag,"tag:yaml.org,2002:str");
  strcmp((char *)node->tag,"tag:yaml.org,2002:str");
  memset(&mark.column,0,0x68);
  mark.column._0_4_ = 6;
  iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
  return iVar1;
}

Assistant:

static int
yaml_emitter_dump_scalar(yaml_emitter_t *emitter, yaml_node_t *node,
        yaml_char_t *anchor)
{
    yaml_event_t event;
    yaml_mark_t mark  = { 0, 0, 0 };

    int plain_implicit = (strcmp((char *)node->tag,
                YAML_DEFAULT_SCALAR_TAG) == 0);
    int quoted_implicit = (strcmp((char *)node->tag,
                YAML_DEFAULT_SCALAR_TAG) == 0);

    SCALAR_EVENT_INIT(event, anchor, node->tag, node->data.scalar.value,
            node->data.scalar.length, plain_implicit, quoted_implicit,
            node->data.scalar.style, mark, mark);

    return yaml_emitter_emit(emitter, &event);
}